

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall
docopt::BranchPattern::fix_identities(BranchPattern *this,UniquePatternSet *patterns)

{
  bool bVar1;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  reference psVar3;
  pair<std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>,_bool> pVar4;
  long *local_70;
  _Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> local_50;
  pair<std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>,_bool> inserted;
  BranchPattern *bp;
  shared_ptr<docopt::Pattern> *child;
  iterator __end2;
  iterator __begin2;
  PatternList *__range2;
  UniquePatternSet *patterns_local;
  BranchPattern *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ::begin(&this->fChildren);
  child = (shared_ptr<docopt::Pattern> *)
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::end(&this->fChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
               ::operator*(&__end2)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>
    ;
    peVar2 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar2 == (element_type *)0x0) {
      local_70 = (long *)0x0;
    }
    else {
      local_70 = (long *)__dynamic_cast(peVar2,&Pattern::typeinfo,&typeinfo,0);
    }
    inserted._8_8_ = local_70;
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 0x48))(local_70,patterns);
    }
    pVar4 = std::
            unordered_set<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::insert(patterns,(value_type *)this_00);
    local_50._M_cur =
         (__node_type *)
         pVar4.first.super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>._M_cur;
    inserted.first.super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>._M_cur._0_1_ =
         pVar4.second;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      psVar3 = std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>::
               operator*((_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true> *)&local_50);
      std::shared_ptr<docopt::Pattern>::operator=((shared_ptr<docopt::Pattern> *)this_00,psVar3);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

virtual void fix_identities(UniquePatternSet& patterns) {
			for(auto& child : fChildren) {
				// this will fix up all its children, if needed
				if (auto bp = dynamic_cast<BranchPattern*>(child.get())) {
					bp->fix_identities(patterns);
				}

				// then we try to add it to the list
				auto inserted = patterns.insert(child);
				if (!inserted.second) {
					// already there? then reuse the existing shared_ptr for that thing
					child = *inserted.first;
				}
			}
		}